

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionKalman4.cpp
# Opt level: O2

void __thiscall
RTFusionKalman4::newIMUData(RTFusionKalman4 *this,RTIMU_DATA *data,RTIMUSettings *settings)

{
  RTVector3 *pRVar1;
  RTQuaternion *this_00;
  uint64_t uVar2;
  int i;
  long lVar3;
  char *pcVar4;
  int j;
  long lVar5;
  RTVector3 *pRVar6;
  RTMatrix4x4 *this_01;
  float fVar7;
  RTVector3 local_3c;
  
  if ((this->super_RTFusion).m_enableGyro == true) {
    pRVar6 = &data->gyro;
  }
  else {
    pRVar6 = &local_3c;
    RTVector3::RTVector3(pRVar6);
  }
  RTVector3::operator=(&this->m_gyro,pRVar6);
  pRVar6 = &(this->super_RTFusion).m_accel;
  RTVector3::operator=(pRVar6,&data->accel);
  pRVar1 = &(this->super_RTFusion).m_compass;
  RTVector3::operator=(pRVar1,&data->compass);
  (this->super_RTFusion).m_compassValid = data->compassValid;
  uVar2 = data->timestamp;
  if ((this->super_RTFusion).m_firstTime == true) {
    (this->super_RTFusion).m_lastFusionTime = uVar2;
    RTFusion::calculatePose(&this->super_RTFusion,pRVar6,pRVar1,settings->m_compassAdjDeclination);
    RTMatrix4x4::fill(&this->m_Fk,0.0);
    this_01 = &this->m_Pkk;
    RTMatrix4x4::fill(this_01,0.0);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        this_01->m_data[0][lVar5] = 0.5;
      }
      this_01 = (RTMatrix4x4 *)(this_01->m_data + 1);
    }
    pRVar6 = &(this->super_RTFusion).m_measuredPose;
    RTQuaternion::fromEuler(&this->m_stateQ,pRVar6);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    RTVector3::operator=(&(this->super_RTFusion).m_fusionPose,pRVar6);
    (this->super_RTFusion).m_firstTime = false;
  }
  else {
    fVar7 = (float)(uVar2 - (this->super_RTFusion).m_lastFusionTime) / 1e+06;
    this->m_timeDelta = fVar7;
    (this->super_RTFusion).m_lastFusionTime = uVar2;
    if (fVar7 <= 0.0) {
      return;
    }
    if ((this->super_RTFusion).m_debug == true) {
      puts("\n------");
      fflush(_stdout);
      printf("IMU update delta time: %f\n",(double)this->m_timeDelta);
      fflush(_stdout);
    }
    RTFusion::calculatePose
              (&this->super_RTFusion,&data->accel,&data->compass,settings->m_compassAdjDeclination);
    predict(this);
    update(this);
    this_00 = &this->m_stateQ;
    pRVar6 = &(this->super_RTFusion).m_fusionPose;
    RTQuaternion::toEuler(this_00,pRVar6);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,this_00);
    if ((this->super_RTFusion).m_debug == true) {
      pRVar1 = &(this->super_RTFusion).m_measuredPose;
      pcVar4 = RTMath::displayRadians("Measured pose",pRVar1);
      printf("%s",pcVar4);
      fflush(_stdout);
      pcVar4 = RTMath::displayRadians("Kalman pose",pRVar6);
      printf("%s",pcVar4);
      fflush(_stdout);
      pcVar4 = RTMath::displayRadians("Measured quat",pRVar1);
      printf("%s",pcVar4);
      fflush(_stdout);
      pcVar4 = RTMath::display("Kalman quat",this_00);
      printf("%s",pcVar4);
      fflush(_stdout);
      pcVar4 = RTMath::display("Error quat",&this->m_stateQError);
      printf("%s",pcVar4);
      fflush(_stdout);
    }
  }
  data->fusionPoseValid = true;
  data->fusionQPoseValid = true;
  RTVector3::operator=(&data->fusionPose,&(this->super_RTFusion).m_fusionPose);
  RTQuaternion::operator=(&data->fusionQPose,&(this->super_RTFusion).m_fusionQPose);
  return;
}

Assistant:

void RTFusionKalman4::newIMUData(RTIMU_DATA& data, const RTIMUSettings *settings)
{
    if (m_enableGyro)
        m_gyro = data.gyro;
    else
        m_gyro = RTVector3();
    m_accel = data.accel;
    m_compass = data.compass;
    m_compassValid = data.compassValid;

    if (m_firstTime) {
        m_lastFusionTime = data.timestamp;
        calculatePose(m_accel, m_compass, settings->m_compassAdjDeclination);
        m_Fk.fill(0);

        //  init covariance matrix to something

        m_Pkk.fill(0);
        for (int i = 0; i < 4; i++)
            for (int j = 0; j < 4; j++)
                m_Pkk.setVal(i,j, 0.5);

        // initialize the observation model Hk
        // Note: since the model is the state vector, this is an identity matrix so it won't be used

        //  initialize the poses

        m_stateQ.fromEuler(m_measuredPose);
        m_fusionQPose = m_stateQ;
        m_fusionPose = m_measuredPose;
        m_firstTime = false;
    } else {
        m_timeDelta = (RTFLOAT)(data.timestamp - m_lastFusionTime) / (RTFLOAT)1000000;
        m_lastFusionTime = data.timestamp;
        if (m_timeDelta <= 0)
            return;

        if (m_debug) {
            HAL_INFO("\n------\n");
            HAL_INFO1("IMU update delta time: %f\n", m_timeDelta);
        }

        calculatePose(data.accel, data.compass, settings->m_compassAdjDeclination);

        predict();
        update();
        m_stateQ.toEuler(m_fusionPose);
        m_fusionQPose = m_stateQ;

        if (m_debug) {
            HAL_INFO(RTMath::displayRadians("Measured pose", m_measuredPose));
            HAL_INFO(RTMath::displayRadians("Kalman pose", m_fusionPose));
            HAL_INFO(RTMath::displayRadians("Measured quat", m_measuredPose));
            HAL_INFO(RTMath::display("Kalman quat", m_stateQ));
            HAL_INFO(RTMath::display("Error quat", m_stateQError));
         }
    }
    data.fusionPoseValid = true;
    data.fusionQPoseValid = true;
    data.fusionPose = m_fusionPose;
    data.fusionQPose = m_fusionQPose;
}